

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O3

void pop_sorted_suite::pop_alternating(void)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  array<int,_4UL> storage;
  array<int,_4UL> expect;
  int local_38 [2];
  
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0x16;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x2c;
  lVar2 = 4;
  do {
    *(undefined4 *)((long)expect._M_elems + lVar2 + -0x14) =
         *(undefined4 *)((long)storage._M_elems + lVar2);
    *(undefined4 *)((long)storage._M_elems + lVar2) = 0xb;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x10);
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x565,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  uVar3 = (ulong)(storage._M_elems[1] < 0x2c);
  uVar4 = (ulong)(storage._M_elems[1] < 0x2c && storage._M_elems[2] < 0x2c);
  uVar5 = (ulong)(storage._M_elems[uVar4 + uVar3] < 0x2c);
  lVar2 = uVar3 * 4 + uVar4 * 4 + uVar5 * 4;
  if (((uint)lVar2 | 4) != 0xc) {
    iVar1 = storage._M_elems[uVar5 + uVar4 + uVar3];
    do {
      *(undefined4 *)((long)storage._M_elems + lVar2) =
           *(undefined4 *)((long)storage._M_elems + lVar2 + 4);
      *(int *)((long)storage._M_elems + lVar2 + 4) = iVar1;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 8);
  }
  expect._M_elems[0] = 0x16;
  expect._M_elems[1] = 0x21;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x56d,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  uVar3 = (ulong)(storage._M_elems[1] < 0x16);
  uVar4 = (ulong)(storage._M_elems[uVar3] < 0x16);
  lVar2 = uVar3 * 4 + uVar4 * 4;
  if ((lVar2 != 4) && ((int)lVar2 != 8)) {
    iVar1 = storage._M_elems[uVar4 + uVar3];
    do {
      *(undefined4 *)((long)storage._M_elems + lVar2) =
           *(undefined4 *)((long)storage._M_elems + lVar2 + 4);
      *(int *)((long)storage._M_elems + lVar2 + 4) = iVar1;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 4);
  }
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x575,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  expect._M_elems[0] = 0x21;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x2c;
  expect._M_elems[3] = 0xb;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x57d,"void pop_sorted_suite::pop_alternating()",storage._M_elems,expect._M_elems,
             expect._M_elems,local_38);
  return;
}

Assistant:

void pop_alternating()
{
    std::array<int, 4> storage = { 11, 22, 33, 44 };
    auto last = storage.end();
    auto first = lower_bound_sorted(storage.begin(), last, 11);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 44);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 22, 33, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 22);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
    --last;
    first = lower_bound_sorted(storage.begin(), last, 33);
    pop_sorted(first, last);
    {
        std::array<int, 4> expect = { 33, 22, 44, 11 };
        BOOST_TEST_ALL_EQ(storage.begin(), storage.end(),
                          expect.begin(), expect.end());
    }
}